

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

void __thiscall
cmake::AppendGlobalGeneratorsDocumentation
          (cmake *this,vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *v)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer puVar2;
  int iVar3;
  bool bVar4;
  pointer puVar5;
  basic_string_view<char,_std::char_traits<char>_> __str;
  cmDocumentationEntry e;
  string defaultName;
  cmDocumentationEntry local_b8;
  vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *local_70;
  long *local_68;
  size_type local_60;
  long local_58 [2];
  basic_string_view<char,_std::char_traits<char>_> local_48;
  pointer local_38;
  
  local_70 = v;
  EvaluateDefaultGlobalGenerator((cmake *)&stack0xffffffffffffffc8);
  (*(code *)(local_38->_M_t).
            super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
            ._M_t.
            super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
            .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>._M_head_impl[3].
            _vptr_cmGlobalGeneratorFactory)(&local_68);
  puVar5 = (this->Generators).
           super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->Generators).
           super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar5 != puVar2) {
    paVar1 = &local_b8.Brief.field_2;
    bVar4 = false;
    do {
      local_b8.Name._M_dataplus._M_p = (pointer)&local_b8.Name.field_2;
      local_b8.Name._M_string_length = 0;
      local_b8.Name.field_2._M_local_buf[0] = '\0';
      local_b8.Brief._M_string_length = 0;
      local_b8.Brief.field_2._M_local_buf[0] = '\0';
      local_b8.CustomNamePrefix = ' ';
      local_b8.Brief._M_dataplus._M_p = (pointer)paVar1;
      (*((puVar5->_M_t).
         super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
         ._M_t.
         super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
         .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>._M_head_impl)->
        _vptr_cmGlobalGeneratorFactory[3])();
      if (bVar4) {
LAB_0031b9d7:
        bVar4 = true;
      }
      else {
        local_48._M_len = local_b8.Name._M_string_length;
        local_48._M_str = local_b8.Name._M_dataplus._M_p;
        __str._M_str = (char *)local_68;
        __str._M_len = local_60;
        iVar3 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                          (&local_48,0,local_60,__str);
        if (iVar3 == 0) {
          local_b8.CustomNamePrefix = '*';
          goto LAB_0031b9d7;
        }
        bVar4 = false;
      }
      std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::
      emplace_back<cmDocumentationEntry>(local_70,&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8.Brief._M_dataplus._M_p != paVar1) {
        operator_delete(local_b8.Brief._M_dataplus._M_p,
                        CONCAT71(local_b8.Brief.field_2._M_allocated_capacity._1_7_,
                                 local_b8.Brief.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8.Name._M_dataplus._M_p != &local_b8.Name.field_2) {
        operator_delete(local_b8.Name._M_dataplus._M_p,
                        CONCAT71(local_b8.Name.field_2._M_allocated_capacity._1_7_,
                                 local_b8.Name.field_2._M_local_buf[0]) + 1);
      }
      puVar5 = puVar5 + 1;
    } while (puVar5 != puVar2);
  }
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  (*(code *)(local_38->_M_t).
            super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
            ._M_t.
            super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
            .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>._M_head_impl[1].
            _vptr_cmGlobalGeneratorFactory)();
  return;
}

Assistant:

void cmake::AppendGlobalGeneratorsDocumentation(
  std::vector<cmDocumentationEntry>& v)
{
  const auto defaultGenerator = this->EvaluateDefaultGlobalGenerator();
  const std::string defaultName = defaultGenerator->GetName();
  bool foundDefaultOne = false;

  for (const auto& g : this->Generators) {
    cmDocumentationEntry e;
    g->GetDocumentation(e);
    if (!foundDefaultOne && cmHasPrefix(e.Name, defaultName)) {
      e.CustomNamePrefix = '*';
      foundDefaultOne = true;
    }
    v.push_back(std::move(e));
  }
}